

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

void __thiscall Assimp::XFileParser::TestForSeparator(XFileParser *this)

{
  char *pcVar1;
  
  if (this->mIsBinaryFormat == false) {
    FindNextNoneWhiteSpace(this);
    pcVar1 = this->mP;
    if ((pcVar1 < this->mEnd) && ((*pcVar1 == ';' || (*pcVar1 == ',')))) {
      this->mP = pcVar1 + 1;
    }
  }
  return;
}

Assistant:

void XFileParser::TestForSeparator()
{
  if( mIsBinaryFormat)
    return;

  FindNextNoneWhiteSpace();
  if( mP >= mEnd)
    return;

  // test and skip
  if( *mP == ';' || *mP == ',')
    mP++;
}